

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::block_is_control_dependent(Compiler *this,SPIRBlock *block)

{
  ushort uVar1;
  bool bVar2;
  uint32_t *puVar3;
  SPIRFunction *func;
  uint uVar4;
  Instruction *i;
  Instruction *instr;
  long lVar5;
  
  instr = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
  for (lVar5 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size * 0xc; lVar5 != 0
      ; lVar5 = lVar5 + -0xc) {
    puVar3 = stream(this,instr);
    uVar1 = instr->op;
    if ((uVar1 - 0x131 < 0x3e) &&
       ((0x3ffffffff0000655U >> ((ulong)(uVar1 - 0x131) & 0x3f) & 1) != 0)) break;
    uVar4 = uVar1 - 0x39;
    if (uVar4 < 0x31) {
      if ((ulong)uVar4 != 0) {
        if ((0x1019540000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_002de350;
        break;
      }
      func = get<spirv_cross::SPIRFunction>(this,puVar3[2]);
      bVar2 = function_is_control_dependent(this,func);
      if (bVar2) break;
    }
    else {
LAB_002de350:
      if ((uVar1 - 0xcf < 0x12) && ((0x201ffU >> (uVar1 - 0xcf & 0x1f) & 1) != 0)) break;
    }
    instr = instr + 1;
  }
  return lVar5 != 0;
}

Assistant:

bool Compiler::block_is_control_dependent(const SPIRBlock &block)
{
	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		case OpFunctionCall:
		{
			uint32_t func = ops[2];
			if (function_is_control_dependent(get<SPIRFunction>(func)))
				return true;
			break;
		}

		// Derivatives
		case OpDPdx:
		case OpDPdxCoarse:
		case OpDPdxFine:
		case OpDPdy:
		case OpDPdyCoarse:
		case OpDPdyFine:
		case OpFwidth:
		case OpFwidthCoarse:
		case OpFwidthFine:

		// Anything implicit LOD
		case OpImageSampleImplicitLod:
		case OpImageSampleDrefImplicitLod:
		case OpImageSampleProjImplicitLod:
		case OpImageSampleProjDrefImplicitLod:
		case OpImageSparseSampleImplicitLod:
		case OpImageSparseSampleDrefImplicitLod:
		case OpImageSparseSampleProjImplicitLod:
		case OpImageSparseSampleProjDrefImplicitLod:
		case OpImageQueryLod:
		case OpImageDrefGather:
		case OpImageGather:
		case OpImageSparseDrefGather:
		case OpImageSparseGather:

		// Anything subgroups
		case OpGroupNonUniformElect:
		case OpGroupNonUniformAll:
		case OpGroupNonUniformAny:
		case OpGroupNonUniformAllEqual:
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformBroadcastFirst:
		case OpGroupNonUniformBallot:
		case OpGroupNonUniformInverseBallot:
		case OpGroupNonUniformBallotBitExtract:
		case OpGroupNonUniformBallotBitCount:
		case OpGroupNonUniformBallotFindLSB:
		case OpGroupNonUniformBallotFindMSB:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpGroupNonUniformIAdd:
		case OpGroupNonUniformFAdd:
		case OpGroupNonUniformIMul:
		case OpGroupNonUniformFMul:
		case OpGroupNonUniformSMin:
		case OpGroupNonUniformUMin:
		case OpGroupNonUniformFMin:
		case OpGroupNonUniformSMax:
		case OpGroupNonUniformUMax:
		case OpGroupNonUniformFMax:
		case OpGroupNonUniformBitwiseAnd:
		case OpGroupNonUniformBitwiseOr:
		case OpGroupNonUniformBitwiseXor:
		case OpGroupNonUniformLogicalAnd:
		case OpGroupNonUniformLogicalOr:
		case OpGroupNonUniformLogicalXor:
		case OpGroupNonUniformQuadBroadcast:
		case OpGroupNonUniformQuadSwap:

		// Control barriers
		case OpControlBarrier:
			return true;

		default:
			break;
		}
	}

	return false;
}